

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O1

int av1_encode(AV1_COMP *cpi,uint8_t *dest,size_t dest_size,EncodeFrameInput *frame_input,
              EncodeFrameParams *frame_params,size_t *frame_size)

{
  double *pdVar1;
  AV1_COMMON *pAVar2;
  uint *puVar3;
  FRAME_TYPE FVar4;
  byte bVar5;
  _Bool _Var6;
  uint8_t uVar7;
  uint8_t uVar8;
  aom_enc_pass aVar9;
  aom_tune_metric aVar10;
  aom_superres_mode aVar11;
  AV1_PRIMARY *pAVar12;
  SequenceHeader *pSVar13;
  RefCntBuffer *pRVar14;
  uint8_t *puVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined6 uVar23;
  int8_t iVar24;
  int8_t iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  size_t dest_size_00;
  int this_index;
  int iVar29;
  uint uVar30;
  int64_t iVar31;
  long lVar32;
  byte bVar33;
  byte bVar34;
  ulong uVar35;
  uint uVar36;
  int iVar37;
  MV_STATS *pMVar38;
  MV_STATS *pMVar39;
  int *piVar40;
  SequenceHeader *pSVar41;
  YV12_BUFFER_CONFIG *pYVar42;
  bool bVar43;
  _Bool _Var44;
  bool bVar45;
  double dVar46;
  double dVar47;
  int largest_tile_id;
  int largest_tile_id2;
  int largest_tile_id1;
  int64_t rate2;
  int64_t sse2;
  CODING_CONTEXT *cc;
  int64_t rate1;
  int64_t sse1;
  int superres_largest_tile_ids [8];
  int64_t rate3;
  int64_t sse3_1;
  int largest_tile_id_1;
  PSNR_STATS psnr;
  int local_1f4;
  RATE_CONTROL *local_1f0;
  size_t local_1e8;
  int local_1e0;
  int local_1dc;
  int64_t local_1d8;
  int64_t local_1d0;
  MV_STATS *local_1c8;
  CODING_CONTEXT *local_1c0;
  int64_t local_1b8;
  double local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  SequenceHeader *local_198;
  RefreshFrameInfo *local_190;
  MV_STATS *local_188;
  RATE_CONTROL *local_180;
  RATE_CONTROL *local_178;
  undefined8 local_170;
  int *local_168;
  int *local_160 [2];
  AV1_COMMON *local_150;
  int local_148 [8];
  int64_t local_128 [10];
  PSNR_STATS local_d8;
  
  bVar33 = 0;
  pYVar42 = frame_input->source;
  cpi->unscaled_source = pYVar42;
  cpi->source = pYVar42;
  cpi->unscaled_last_source = frame_input->last_source;
  (cpi->common).current_frame.refresh_frame_flags = frame_params->refresh_frame_flags;
  (cpi->common).features.error_resilient_mode = frame_params->error_resilient_mode != 0;
  (cpi->common).features.primary_ref_frame = frame_params->primary_ref_frame;
  FVar4 = frame_params->frame_type;
  (cpi->common).current_frame.frame_type = FVar4;
  (cpi->common).show_frame = frame_params->show_frame;
  cpi->ref_frame_flags = frame_params->ref_frame_flags;
  cpi->speed = frame_params->speed;
  (cpi->common).show_existing_frame = frame_params->show_existing_frame;
  cpi->existing_fb_idx_to_show = frame_params->existing_fb_idx_to_show;
  uVar16 = *(undefined8 *)(frame_params->remapped_ref_idx + 2);
  uVar17 = *(undefined8 *)(frame_params->remapped_ref_idx + 4);
  uVar18 = *(undefined8 *)(frame_params->remapped_ref_idx + 6);
  *(undefined8 *)(cpi->common).remapped_ref_idx = *(undefined8 *)frame_params->remapped_ref_idx;
  *(undefined8 *)((cpi->common).remapped_ref_idx + 2) = uVar16;
  *(undefined8 *)((cpi->common).remapped_ref_idx + 4) = uVar17;
  *(undefined8 *)((cpi->common).remapped_ref_idx + 6) = uVar18;
  _Var44 = (frame_params->refresh_frame).bwd_ref_frame;
  (cpi->refresh_frame).golden_frame = (frame_params->refresh_frame).golden_frame;
  (cpi->refresh_frame).bwd_ref_frame = _Var44;
  (cpi->refresh_frame).alt_ref_frame = (frame_params->refresh_frame).alt_ref_frame;
  if ((FVar4 == '\0') && ((cpi->ppi->gf_group).refbuf_state[cpi->gf_frame_index] == '\0')) {
    (cpi->common).current_frame.frame_number = 0;
  }
  uVar36 = frame_params->order_offset + (cpi->common).current_frame.frame_number;
  (cpi->common).current_frame.order_hint = uVar36;
  (cpi->common).current_frame.display_order_hint = uVar36;
  pSVar41 = (cpi->common).seq_params;
  (cpi->common).current_frame.order_hint =
       ~(-1 << ((char)(pSVar41->order_hint_info).order_hint_bits_minus_1 + 1U & 0x1f)) & uVar36;
  pAVar12 = cpi->ppi;
  uVar30 = 1;
  if (uVar36 != 0) {
    uVar36 = (pAVar12->gf_group).layer_depth[cpi->gf_frame_index];
    if (uVar36 == 6) {
      uVar30 = (pAVar12->gf_group).max_layer_depth;
    }
    else if ((uVar36 != 7) && (uVar30 = 1, 1 < (int)uVar36)) {
      uVar30 = uVar36;
    }
  }
  (cpi->common).current_frame.pyramid_level = uVar30;
  aVar9 = (cpi->oxcf).pass;
  if ((aVar9 == AOM_RC_FIRST_PASS) || (cpi->compressor_stage == '\x01')) {
    if ((cpi->oxcf).q_cfg.use_fixed_qp_offsets != 0) {
      av1_noop_first_pass_frame(cpi,frame_input->ts_duration);
      return 0;
    }
    av1_first_pass(cpi,frame_input->ts_duration);
    return 0;
  }
  if (aVar9 == AOM_RC_FIRST_PASS) {
    return 1;
  }
  (cpi->td).mb.e_mbd.cur_buf = pYVar42;
  local_1e8 = dest_size;
  if (((((aVar9 != AOM_RC_ONE_PASS) || (pAVar12->lap_enabled != 0)) || ((cpi->oxcf).mode != '\x01'))
      || ((cpi->oxcf).gf_cfg.lag_in_frames != 0)) &&
     (((cpi->oxcf).q_cfg.deltaq_mode == '\x02' &&
      (pdVar1 = &((pAVar12->twopass).stats_buf_ctx)->total_stats->frame_avg_wavelet_energy,
      *pdVar1 <= 0.0 && *pdVar1 != 0.0)))) {
    piVar40 = &cpi->initial_mbs;
    if ((cpi->oxcf).resize_cfg.resize_mode == '\0') {
      piVar40 = &(cpi->common).mi_params.MBs;
    }
    pYVar42 = cpi->unfiltered_source;
    lVar32 = (ulong)(cpi->is_screen_content_type == 0) * 3;
    bVar34 = block_size_wide[lVar32 + 3];
    bVar5 = block_size_high[lVar32 + 3];
    local_1f0 = (RATE_CONTROL *)(double)*piVar40;
    iVar31 = av1_haar_ac_sad_mxn_uint8_input
                       ((pYVar42->field_5).field_0.y_buffer,(pYVar42->field_4).field_0.y_stride,
                        pYVar42->flags & 8,
                        (uint)(bVar5 >> 3) *
                        ((int)((uint)bVar5 + (pYVar42->field_3).field_0.y_crop_height + -1) /
                        (int)(uint)bVar5),
                        (uint)(bVar34 >> 3) *
                        ((int)((uint)bVar34 + (pYVar42->field_2).field_0.y_crop_width + -1) /
                        (int)(uint)bVar34));
    dVar46 = log1p((double)iVar31 / (double)local_1f0);
    (cpi->twopass_frame).frame_avg_haar_energy = dVar46;
  }
  bVar34 = (cpi->common).current_frame.frame_type;
  ((cpi->common).cur_frame)->frame_type = bVar34;
  _Var44 = (cpi->oxcf).tile_cfg.enable_large_scale_tile;
  (cpi->common).tiles.large_scale = (uint)_Var44;
  (cpi->common).tiles.single_tile_decoding = (uint)(cpi->oxcf).tile_cfg.enable_single_tile_decoding;
  _Var6 = (cpi->common).features.error_resilient_mode;
  bVar43 = false;
  if (((_Var6 == false) &&
      (pSVar13 = (cpi->common).seq_params, (pSVar13->order_hint_info).enable_ref_frame_mvs != 0)) &&
     ((pSVar13->order_hint_info).enable_order_hint != 0)) {
    bVar43 = (bVar34 & 0xfd) != 0;
  }
  (cpi->common).features.allow_ref_frame_mvs =
       ((cpi->common).features.allow_ref_frame_mvs & bVar43) != 0 && _Var44 == false;
  if (((cpi->oxcf).motion_mode_cfg.allow_warped_motion == true) &&
     (_Var6 == false && (bVar34 & 0xfd) != 0)) {
    _Var44 = ((cpi->common).seq_params)->enable_warped_motion != '\0';
  }
  else {
    _Var44 = false;
  }
  (cpi->common).features.allow_warped_motion = _Var44;
  cpi->last_frame_type = bVar34;
  if ((bVar34 & 0xfd) == 0) {
    cpi->frames_since_last_update = 0;
  }
  if (bVar34 == 3) {
    (cpi->ppi->gf_group).update_type[(cpi->ppi->gf_group).size] = '\x02';
  }
  pAVar2 = &cpi->common;
  if (((cpi->common).show_existing_frame != 0) &&
     (((cpi->common).features.error_resilient_mode != true ||
      ((pAVar2->current_frame).frame_type == '\0')))) {
    av1_finalize_encoded_frame(cpi);
    local_128[2] = local_128[2] & 0xffffffff00000000;
    (cpi->rc).coefficient_size = 0;
    iVar29 = av1_pack_bitstream(cpi,dest,local_1e8,frame_size,(int *)(local_128 + 2));
    bVar43 = true;
    if (iVar29 == 0) {
      if ((pSVar41->frame_id_numbers_present_flag != '\0') &&
         ((pAVar2->current_frame).frame_type == '\0')) {
        iVar29 = (cpi->common).ref_frame_id[cpi->existing_fb_idx_to_show];
        lVar32 = 0;
        do {
          piVar40 = (cpi->common).ref_frame_id + lVar32;
          *piVar40 = iVar29;
          piVar40[1] = iVar29;
          piVar40[2] = iVar29;
          piVar40[3] = iVar29;
          lVar32 = lVar32 + 4;
        } while (lVar32 != 8);
      }
      if ((cpi->common).show_frame != 0) {
        cpi->last_show_frame_buf = (cpi->common).cur_frame;
      }
      av1_set_target_rate(cpi,(cpi->common).width,(cpi->common).height);
      if ((((cpi->ppi->b_calculate_psnr != 0) && ((cpi->oxcf).pass != AOM_RC_FIRST_PASS)) &&
          (cpi->compressor_stage != '\x01')) &&
         (((cpi->common).show_frame != 0 && (cpi->is_dropped_frame == false)))) {
        pRVar14 = (cpi->common).cur_frame;
        iVar29 = (pRVar14->buf).field_2.field_0.y_crop_width;
        iVar37 = (pRVar14->buf).field_3.field_0.y_crop_height;
        pSVar41 = (cpi->common).seq_params;
        uVar8 = pSVar41->monochrome;
        pYVar42 = cpi->unscaled_source;
        if (((pYVar42->field_2).field_0.y_crop_width != iVar29) ||
           ((pYVar42->field_3).field_0.y_crop_height != iVar37)) {
          pYVar42 = &cpi->scaled_source;
          iVar29 = aom_realloc_frame_buffer
                             (pYVar42,iVar29,iVar37,pSVar41->subsampling_x,pSVar41->subsampling_y,
                              (uint)pSVar41->use_highbitdepth,0x120,
                              (cpi->common).features.byte_alignment,(aom_codec_frame_buffer_t *)0x0,
                              (aom_get_frame_buffer_cb_fn_t)0x0,(void *)0x0,cpi->alloc_pyramid,0);
          if (iVar29 != 0) {
            aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                               "Failed to reallocate scaled source buffer");
          }
          _Var44 = av1_resize_and_extend_frame_nonnormative
                             (cpi->unscaled_source,pYVar42,((cpi->common).seq_params)->bit_depth,
                              (uint)(uVar8 == '\0') * 2 + 1);
          if (!_Var44) {
            aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                               "Failed to reallocate buffers during resize");
          }
        }
        cpi->source = pYVar42;
      }
      if (cpi->use_ducky_encode != 0) {
        aom_calc_psnr(cpi->source,&((cpi->common).cur_frame)->buf,&local_d8);
        (cpi->ducky_encode_info).frame_result.global_order_idx =
             ((cpi->common).cur_frame)->display_order_hint;
        (cpi->ducky_encode_info).frame_result.q_index = (cpi->common).quant_params.base_qindex;
        (cpi->ducky_encode_info).frame_result.rdmult = (cpi->rd).RDMULT;
        (cpi->ducky_encode_info).frame_result.rate = (int)*frame_size << 3;
        (cpi->ducky_encode_info).frame_result.dist = local_d8.sse[0];
        (cpi->ducky_encode_info).frame_result.psnr = local_d8.psnr[0];
      }
      (cpi->frame_index_set).show_frame_count = (cpi->frame_index_set).show_frame_count + 1;
      puVar3 = &(cpi->common).current_frame.frame_number;
      *puVar3 = *puVar3 + 1;
      bVar43 = false;
    }
    goto LAB_001b303b;
  }
  if (((cpi->oxcf).pass == AOM_RC_FIRST_PASS) ||
     ((((cpi->compressor_stage == '\x01' ||
        ((cpi->common).features.allow_screen_content_tools != true)) ||
       (((pAVar2->current_frame).frame_type & 0xfd) == 0)) ||
      ((cpi->sf).rt_sf.use_nonrd_pick_mode != 0)))) {
LAB_001b1b75:
    (cpi->common).features.cur_frame_force_integer_mv = false;
  }
  else {
    uVar8 = ((cpi->common).seq_params)->force_integer_mv;
    if (uVar8 == '\x02') {
      if (cpi->unscaled_last_source == (YV12_BUFFER_CONFIG *)0x0) goto LAB_001b1b75;
      iVar29 = av1_is_integer_mv(cpi->source,cpi->unscaled_last_source,&cpi->force_intpel_info);
      bVar43 = iVar29 == 0;
    }
    else {
      bVar43 = uVar8 == '\0';
    }
    (cpi->common).features.cur_frame_force_integer_mv = !bVar43;
  }
  (cpi->td).mb.e_mbd.cur_frame_force_integer_mv =
       (uint)(cpi->common).features.cur_frame_force_integer_mv;
  (cpi->common).lf.mode_ref_delta_update = '\0';
  bVar34 = (cpi->common).current_frame.frame_type;
  if (((bVar34 < 4) && (bVar34 != 1)) &&
     (av1_reset_segment_features(pAVar2), (cpi->common).seg.enabled != '\0')) {
    (cpi->common).seg.update_map = '\x01';
    (cpi->common).seg.update_data = '\x01';
  }
  uVar30 = 1;
  if ((cpi->oxcf).tile_cfg.mtu == 0) {
    uVar30 = (cpi->oxcf).tile_cfg.num_tile_groups;
  }
  cpi->num_tg = uVar30;
  if ((((cpi->oxcf).pass == AOM_RC_ONE_PASS) && (cpi->ppi->lap_enabled == 0)) &&
     ((cpi->oxcf).rc_cfg.mode == AOM_CBR)) {
    if (((0 < (cpi->svc).spatial_layer_id) && ((cpi->oxcf).rc_cfg.target_bandwidth == 0)) ||
       (iVar29 = av1_rc_drop_frame(cpi), iVar29 != 0)) {
      cpi->is_dropped_frame = true;
    }
    if (cpi->is_dropped_frame != true) goto LAB_001b1d12;
    av1_setup_frame_size(cpi);
    av1_set_mv_search_params(cpi);
    av1_rc_postencode_update_drop_frame(cpi);
    _Var44 = (cpi->refresh_frame).golden_frame;
    bVar33 = 1;
    lVar32 = 0x85a7;
    do {
      piVar40 = *(int **)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar32 * 8);
      if (((lVar32 == 0x85aa) && ((cpi->oxcf).pass == AOM_RC_ONE_PASS)) &&
         ((((cpi->ppi->lap_enabled == 0 &&
            (((cpi->oxcf).mode == '\x01' && ((cpi->oxcf).gf_cfg.lag_in_frames == 0)))) &&
           (cpi->ppi->use_svc == 0)) && (piVar40 != (int *)0x0)))) {
        pRVar14 = (cpi->common).ref_frame_map[(cpi->common).remapped_ref_idx[3]];
        if (piVar40[0x13c] == (pRVar14->buf).field_2.field_0.y_crop_width) {
          bVar43 = piVar40[0x13e] == (pRVar14->buf).field_3.field_0.y_crop_height;
        }
        else {
          bVar43 = false;
        }
        bVar33 = bVar43 | _Var44 & 1U;
      }
      if ((piVar40 != (int *)0x0) && ((lVar32 != 0x85aa || (bVar33 != 0)))) {
        *piVar40 = *piVar40 + -1;
        *(undefined8 *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar32 * 8) =
             0;
      }
      lVar32 = lVar32 + 1;
    } while (lVar32 != 0x85ae);
    (cpi->ppi->gf_group).is_frame_dropped[cpi->gf_frame_index] = true;
  }
  else {
LAB_001b1d12:
    aVar10 = (cpi->oxcf).tune_cfg.tuning;
    if ((aVar10 < (AOM_TUNE_BUTTERAUGLI|AOM_TUNE_VMAF_WITH_PREPROCESSING)) &&
       ((0xc02U >> (aVar10 & 0x1f) & 1) != 0)) {
      av1_set_mb_ssim_rdmult_scaling(cpi);
    }
    if (((cpi->oxcf).q_cfg.deltaq_mode == '\x03') && ((cpi->sf).rt_sf.use_nonrd_pick_mode == 0)) {
      av1_init_mb_wiener_var_buffer(cpi);
      av1_set_mb_wiener_variance(cpi);
    }
    if ((cpi->oxcf).q_cfg.deltaq_mode == '\x04') {
      av1_init_mb_ur_var_buffer(cpi);
      av1_set_mb_ur_variance(cpi);
    }
    if (pSVar41->frame_id_numbers_present_flag != '\0') {
      iVar29 = (cpi->common).current_frame_id;
      if (iVar29 == -1) {
        puVar15 = (cpi->source->field_5).buffers[0];
        if ((cpi->source->flags & 8) == 0) {
          uVar8 = *puVar15;
          uVar7 = puVar15[1];
        }
        else {
          uVar8 = *(uint8_t *)((long)puVar15 * 2);
          uVar7 = *(uint8_t *)((long)puVar15 * 2 + 2);
        }
        iVar37 = (int)((long)(ulong)CONCAT11(uVar7,uVar8) %
                      (long)(1 << ((byte)pSVar41->frame_id_length & 0x1f)));
        (cpi->common).current_frame_id = iVar37;
        iVar29 = 0x37;
        if ((cpi->oxcf).kf_cfg.sframe_dist == 0) {
          iVar29 = iVar37;
        }
      }
      else {
        iVar37 = 1 << ((byte)pSVar41->frame_id_length & 0x1f);
        iVar29 = (iVar29 + iVar37 + 1) % iVar37;
      }
      (cpi->common).current_frame_id = iVar29;
    }
    uVar8 = (cpi->oxcf).algo_cfg.cdf_update_mode;
    _Var44 = true;
    if (uVar8 == '\0') {
LAB_001b2132:
      (cpi->common).features.disable_cdf_update = _Var44;
    }
    else {
      if (uVar8 == '\x02') {
        if (((cpi->oxcf).mode & 0xfd) == 0) {
          if (((pAVar2->current_frame).frame_type & 0xfd) == 0) {
LAB_001b2118:
            _Var44 = false;
          }
          else {
            _Var44 = (cpi->common).show_frame != 0;
          }
        }
        else {
LAB_001b20c6:
          if (((cpi->svc).number_spatial_layers == 1) && ((cpi->svc).number_temporal_layers == 1)) {
            if ((((((pAVar2->current_frame).frame_type & 0xfd) == 0) ||
                 ((((iVar29 = (cpi->resize_pending_params).width, iVar29 != 0 &&
                    (iVar37 = (cpi->resize_pending_params).height, iVar37 != 0)) &&
                   (((cpi->common).width != iVar29 || ((cpi->common).height != iVar37)))) ||
                  (((cpi->rc).high_source_sad != 0 || ((cpi->rc).frames_since_key < 0x1e)))))) ||
                (((cpi->oxcf).q_cfg.aq_mode == '\x03' &&
                 (cpi->cyclic_refresh->counter_encode_maxq_scene_change < 0x1e)))) ||
               ((8 < cpi->frames_since_last_update && ((cpi->rc).frame_source_sad != 0))))
            goto LAB_001b2118;
          }
          else {
            iVar29 = (cpi->svc).number_temporal_layers;
            if (1 < iVar29) {
              _Var44 = (cpi->svc).temporal_layer_id == iVar29 + -1;
            }
          }
        }
        goto LAB_001b2132;
      }
      if (uVar8 == '\x01') {
        if ((((cpi->sf).rt_sf.disable_cdf_update_non_reference_frame != true) ||
            ((cpi->ppi->rtc_ref).non_reference_frame == 0)) || ((cpi->rc).frames_since_key < 3)) {
          if ((cpi->sf).rt_sf.selective_cdf_update == 0) goto LAB_001b2118;
          goto LAB_001b20c6;
        }
        goto LAB_001b2132;
      }
    }
    if ((cpi->do_frame_data_update == false) &&
       ((cpi->ppi->gf_group).update_type[cpi->gf_frame_index] == '\x06')) {
      (cpi->common).features.disable_cdf_update = true;
    }
    if (((cpi->oxcf).tool_cfg.enable_global_motion == true) &&
       (((pAVar2->current_frame).frame_type & 0xfd) != 0)) {
      aom_invalidate_pyramid(cpi->source->y_pyramid);
      av1_invalidate_corner_list(cpi->source->corners);
    }
    local_1f4 = 0;
    iVar29 = av1_superres_in_recode_allowed(cpi);
    local_150 = pAVar2;
    if (iVar29 == 0) {
      aVar11 = cpi->superres_mode;
      cpi->superres_mode = (cpi->oxcf).superres_cfg.superres_mode;
      iVar29 = encode_with_recode_loop_and_filter
                         (cpi,frame_size,dest,local_1e8,(int64_t *)0x0,(int64_t *)0x0,&local_1f4);
      bVar43 = true;
      if (iVar29 != 0) goto LAB_001b303b;
      cpi->superres_mode = aVar11;
    }
    else {
      av1_save_all_coding_context(cpi);
      local_1b0 = NAN;
      local_1b8 = 0x7fffffffffffffff;
      local_1dc = 0;
      local_1d0 = 0x7fffffffffffffff;
      local_1d8 = 0x7fffffffffffffff;
      bVar34 = (cpi->ppi->gf_group).update_type[cpi->gf_frame_index];
      local_1a8 = (ulong)bVar34;
      local_1a0 = (ulong)((cpi->common).seq_params)->bit_depth;
      if ((cpi->sf).hl_sf.superres_auto_search_type == '\0') {
        if ((byte)(bVar34 - 6) < 0xfe) {
          local_190 = &cpi->refresh_frame;
          local_1c0 = &cpi->coding_context;
          local_1c8 = (MV_STATS *)&(cpi->common).lf;
          local_160[1] = (cpi->common).cdef_info.cdef_strengths;
          local_160[0] = (cpi->coding_context).cdef_info.cdef_strengths;
          local_168 = (cpi->common).cdef_info.cdef_uv_strengths;
          local_170 = (cpi->coding_context).cdef_info.cdef_uv_strengths;
          local_178 = &cpi->rc;
          local_180 = &(cpi->coding_context).rc;
          local_188 = &(cpi->coding_context).mv_stats;
          uVar35 = 9;
          bVar43 = false;
          local_1f0 = (RATE_CONTROL *)dest;
          local_198 = pSVar41;
          do {
            (cpi->oxcf).superres_cfg.superres_scale_denominator = (uint8_t)uVar35;
            (cpi->oxcf).superres_cfg.superres_kf_scale_denominator = (uint8_t)uVar35;
            cpi->superres_mode = AOM_SUPERRES_AUTO;
            uVar36 = encode_with_recode_loop_and_filter
                               (cpi,frame_size,(uint8_t *)local_1f0,local_1e8,local_128 + uVar35 + 1
                                ,(int64_t *)(local_160 + uVar35),
                                (int *)((long)&local_170 + uVar35 * 4 + 4));
            cpi->superres_mode = AOM_SUPERRES_NONE;
            uVar30 = uVar36;
            if (uVar36 == 0) {
              uVar16 = *(undefined8 *)(local_1c0->lf).filter_level;
              uVar17 = *(undefined8 *)&(local_1c0->lf).filter_level_u;
              uVar18 = *(undefined8 *)(local_1c0->lf).backup_filter_level;
              uVar19 = *(undefined8 *)&(local_1c0->lf).backup_filter_level_u;
              uVar20 = *(undefined8 *)((local_1c0->lf).ref_deltas + 2);
              *(undefined8 *)(local_1c8->mv_joint_count + 2) =
                   *(undefined8 *)&(local_1c0->lf).sharpness_level;
              *(undefined8 *)&local_1c8->last_bit_zero = uVar20;
              *(undefined8 *)&local_1c8->intra_count = uVar18;
              *(undefined8 *)local_1c8->mv_joint_count = uVar19;
              *(undefined8 *)local_1c8 = uVar16;
              *(undefined8 *)&local_1c8->order = uVar17;
              (cpi->common).cdef_info.cdef_bits = (cpi->coding_context).cdef_info.cdef_bits;
              uVar16 = *(undefined8 *)local_160[0];
              uVar17 = *(undefined8 *)(local_160[0] + 2);
              uVar18 = *(undefined8 *)(local_160[0] + 4);
              uVar19 = *(undefined8 *)(local_160[0] + 6);
              uVar20 = *(undefined8 *)(local_160[0] + 8);
              uVar21 = *(undefined8 *)(local_160[0] + 10);
              uVar22 = *(undefined8 *)(local_160[0] + 0xe);
              *(undefined8 *)(local_160[1] + 0xc) = *(undefined8 *)(local_160[0] + 0xc);
              *(undefined8 *)(local_160[1] + 0xe) = uVar22;
              *(undefined8 *)(local_160[1] + 8) = uVar20;
              *(undefined8 *)(local_160[1] + 10) = uVar21;
              *(undefined8 *)(local_160[1] + 4) = uVar18;
              *(undefined8 *)(local_160[1] + 6) = uVar19;
              *(undefined8 *)local_160[1] = uVar16;
              *(undefined8 *)(local_160[1] + 2) = uVar17;
              uVar16 = *(undefined8 *)local_170;
              uVar17 = *(undefined8 *)(local_170 + 2);
              uVar18 = *(undefined8 *)(local_170 + 4);
              uVar19 = *(undefined8 *)(local_170 + 6);
              uVar20 = *(undefined8 *)(local_170 + 8);
              uVar21 = *(undefined8 *)(local_170 + 10);
              uVar22 = *(undefined8 *)(local_170 + 0xe);
              *(undefined8 *)(local_168 + 0xc) = *(undefined8 *)(local_170 + 0xc);
              *(undefined8 *)(local_168 + 0xe) = uVar22;
              *(undefined8 *)(local_168 + 8) = uVar20;
              *(undefined8 *)(local_168 + 10) = uVar21;
              *(undefined8 *)(local_168 + 4) = uVar18;
              *(undefined8 *)(local_168 + 6) = uVar19;
              *(undefined8 *)local_168 = uVar16;
              *(undefined8 *)(local_168 + 2) = uVar17;
              iVar29 = (cpi->coding_context).cdef_info.nb_cdef_strengths;
              (cpi->common).cdef_info.cdef_damping = (cpi->coding_context).cdef_info.cdef_damping;
              (cpi->common).cdef_info.nb_cdef_strengths = iVar29;
              memcpy(local_178,local_180,0x140);
              pAVar12 = cpi->ppi;
              pMVar38 = local_188;
              pMVar39 = &pAVar12->mv_stats;
              for (lVar32 = 9; lVar32 != 0; lVar32 = lVar32 + -1) {
                iVar29 = pMVar38->q;
                pMVar39->high_prec = pMVar38->high_prec;
                pMVar39->q = iVar29;
                pMVar38 = (MV_STATS *)((long)pMVar38 + (ulong)bVar33 * -0x10 + 8);
                pMVar39 = (MV_STATS *)((long)pMVar39 + ((ulong)bVar33 * -2 + 1) * 8);
              }
              (pAVar12->mv_stats).valid = local_188->valid;
              if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
                _Var44 = local_190->golden_frame;
                bVar34 = 1;
                lVar32 = 0x85a7;
                do {
                  piVar40 = *(int **)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) +
                                     lVar32 * 8);
                  if (((((lVar32 == 0x85aa) && ((cpi->oxcf).pass == AOM_RC_ONE_PASS)) &&
                       (cpi->ppi->lap_enabled == 0)) &&
                      (((cpi->oxcf).mode == '\x01' && ((cpi->oxcf).gf_cfg.lag_in_frames == 0)))) &&
                     ((cpi->ppi->use_svc == 0 && (piVar40 != (int *)0x0)))) {
                    pRVar14 = (cpi->common).ref_frame_map[(cpi->common).remapped_ref_idx[3]];
                    if (piVar40[0x13c] == (pRVar14->buf).field_2.field_0.y_crop_width) {
                      bVar45 = piVar40[0x13e] == (pRVar14->buf).field_3.field_0.y_crop_height;
                    }
                    else {
                      bVar45 = false;
                    }
                    bVar34 = bVar45 | _Var44 & 1U;
                  }
                  if ((piVar40 != (int *)0x0) && ((lVar32 != 0x85aa || (bVar34 != 0)))) {
                    *piVar40 = *piVar40 + -1;
                    *(undefined8 *)
                     ((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar32 * 8) = 0;
                  }
                  lVar32 = lVar32 + 1;
                } while (lVar32 != 0x85ae);
              }
              uVar30 = (uint)dest;
            }
            if (uVar36 != 0) break;
            bVar43 = 0xf < uVar35;
            uVar35 = uVar35 + 1;
            dest = (uint8_t *)(ulong)uVar30;
          } while (uVar35 != 0x11);
          pSVar41 = local_198;
          if (!bVar43) goto LAB_001b2ddd;
          (cpi->oxcf).superres_cfg.superres_scale_denominator = '\b';
          (cpi->oxcf).superres_cfg.superres_kf_scale_denominator = '\b';
          dest = (uint8_t *)local_1f0;
        }
        else {
          local_148[4] = 0;
          local_148[5] = 0;
          local_148[6] = 0;
          local_148[7] = 0;
          local_148[0] = 0;
          local_148[1] = 0;
          local_148[2] = 0;
          local_148[3] = 0;
          lVar32 = 0;
          do {
            local_d8.psnr[lVar32] = NAN;
            local_d8.psnr[lVar32 + 1] = NAN;
            local_128[lVar32 + 2] = 0x7fffffffffffffff;
            local_128[lVar32 + 3] = 0x7fffffffffffffff;
            lVar32 = lVar32 + 2;
          } while (lVar32 != 8);
        }
        dest_size_00 = local_1e8;
        uVar30 = encode_with_recode_loop_and_filter
                           (cpi,frame_size,dest,local_1e8,&local_1d0,&local_1d8,&local_1e0);
        uVar35 = local_1a0;
        if (uVar30 == 0) {
          local_1f0 = (RATE_CONTROL *)dest;
          iVar29 = av1_compute_rd_mult_based_on_qindex
                             ((aom_bit_depth_t)local_1a0,(FRAME_UPDATE_TYPE)local_1a8,
                              (cpi->common).quant_params.base_qindex,(cpi->oxcf).tune_cfg.tuning);
          bVar34 = (char)uVar35 * '\x02' - 0x10;
          iVar37 = -1;
          dVar46 = 1.79769313486232e+308;
          lVar32 = 0;
          do {
            dVar47 = (double)((long)local_d8.psnr[lVar32] >> (bVar34 & 0x3f)) * 128.0 +
                     (double)local_128[lVar32 + 2] * (double)iVar29 * 0.001953125;
            if (dVar47 < dVar46) {
              local_1dc = local_148[lVar32];
              iVar37 = (int)lVar32 + 9;
              dVar46 = dVar47;
              local_1b8 = local_128[lVar32 + 2];
              local_1b0 = local_d8.psnr[lVar32];
            }
            lVar32 = lVar32 + 1;
          } while (lVar32 != 8);
          if ((double)(local_1d0 >> (bVar34 & 0x3f)) * 128.0 +
              (double)iVar29 * (double)local_1d8 * 0.001953125 <= dVar46) {
            local_1f4 = local_1e0;
            uVar30 = 0;
          }
          else {
            uVar16 = *(undefined8 *)(cpi->coding_context).lf.filter_level;
            iVar27 = (cpi->coding_context).lf.filter_level_u;
            iVar28 = (cpi->coding_context).lf.filter_level_v;
            uVar17 = *(undefined8 *)(cpi->coding_context).lf.backup_filter_level;
            iVar29 = (cpi->coding_context).lf.backup_filter_level_u;
            iVar26 = (cpi->coding_context).lf.backup_filter_level_v;
            uVar8 = (cpi->coding_context).lf.mode_ref_delta_enabled;
            uVar7 = (cpi->coding_context).lf.mode_ref_delta_update;
            iVar24 = (cpi->coding_context).lf.ref_deltas[0];
            iVar25 = (cpi->coding_context).lf.ref_deltas[1];
            uVar18 = *(undefined8 *)((cpi->coding_context).lf.ref_deltas + 2);
            uVar19 = *(undefined8 *)(cpi->coding_context).cdef_info.cdef_strengths;
            uVar20 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 2);
            (cpi->common).lf.sharpness_level = (cpi->coding_context).lf.sharpness_level;
            (cpi->common).lf.mode_ref_delta_enabled = uVar8;
            (cpi->common).lf.mode_ref_delta_update = uVar7;
            (cpi->common).lf.ref_deltas[0] = iVar24;
            (cpi->common).lf.ref_deltas[1] = iVar25;
            *(undefined8 *)((cpi->common).lf.ref_deltas + 2) = uVar18;
            *(undefined8 *)(cpi->common).lf.backup_filter_level = uVar17;
            (cpi->common).lf.backup_filter_level_u = iVar29;
            (cpi->common).lf.backup_filter_level_v = iVar26;
            *(undefined8 *)(cpi->common).lf.filter_level = uVar16;
            (cpi->common).lf.filter_level_u = iVar27;
            (cpi->common).lf.filter_level_v = iVar28;
            (cpi->common).cdef_info.cdef_bits = (cpi->coding_context).cdef_info.cdef_bits;
            *(undefined8 *)(cpi->common).cdef_info.cdef_strengths = uVar19;
            *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 2) = uVar20;
            uVar16 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 6);
            *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 4) =
                 *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 4);
            *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 6) = uVar16;
            uVar16 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 10);
            *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 8) =
                 *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 8);
            *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 10) = uVar16;
            uVar16 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 0xe);
            *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 0xc) =
                 *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 0xc);
            *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 0xe) = uVar16;
            uVar16 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 2);
            *(undefined8 *)(cpi->common).cdef_info.cdef_uv_strengths =
                 *(undefined8 *)(cpi->coding_context).cdef_info.cdef_uv_strengths;
            *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 2) = uVar16;
            uVar16 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 6);
            *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 4) =
                 *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 4);
            *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 6) = uVar16;
            uVar16 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 10);
            *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 8) =
                 *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 8);
            *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 10) = uVar16;
            uVar16 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 0xe);
            *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 0xc) =
                 *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 0xc);
            *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 0xe) = uVar16;
            iVar29 = (cpi->coding_context).cdef_info.nb_cdef_strengths;
            (cpi->common).cdef_info.cdef_damping = (cpi->coding_context).cdef_info.cdef_damping;
            (cpi->common).cdef_info.nb_cdef_strengths = iVar29;
            memcpy(&cpi->rc,&(cpi->coding_context).rc,0x140);
            pAVar12 = cpi->ppi;
            pMVar38 = &(cpi->coding_context).mv_stats;
            pMVar39 = &pAVar12->mv_stats;
            for (lVar32 = 9; lVar32 != 0; lVar32 = lVar32 + -1) {
              iVar29 = pMVar38->q;
              pMVar39->high_prec = pMVar38->high_prec;
              pMVar39->q = iVar29;
              pMVar38 = (MV_STATS *)((long)pMVar38 + (ulong)bVar33 * -0x10 + 8);
              pMVar39 = (MV_STATS *)((long)pMVar39 + ((ulong)bVar33 * -2 + 1) * 8);
            }
            (pAVar12->mv_stats).valid = (cpi->coding_context).mv_stats.valid;
            if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
              _Var44 = (cpi->refresh_frame).golden_frame;
              bVar33 = 1;
              lVar32 = 0x85a7;
              do {
                piVar40 = *(int **)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) +
                                   lVar32 * 8);
                if ((((lVar32 == 0x85aa) && ((cpi->oxcf).pass == AOM_RC_ONE_PASS)) &&
                    (cpi->ppi->lap_enabled == 0)) &&
                   ((((cpi->oxcf).mode == '\x01' && ((cpi->oxcf).gf_cfg.lag_in_frames == 0)) &&
                    ((cpi->ppi->use_svc == 0 && (piVar40 != (int *)0x0)))))) {
                  pRVar14 = (cpi->common).ref_frame_map[(cpi->common).remapped_ref_idx[3]];
                  if (piVar40[0x13c] == (pRVar14->buf).field_2.field_0.y_crop_width) {
                    bVar43 = piVar40[0x13e] == (pRVar14->buf).field_3.field_0.y_crop_height;
                  }
                  else {
                    bVar43 = false;
                  }
                  bVar33 = bVar43 | _Var44 & 1U;
                }
                if ((piVar40 != (int *)0x0) && ((lVar32 != 0x85aa || (bVar33 != 0)))) {
                  *piVar40 = *piVar40 + -1;
                  *(undefined8 *)
                   ((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar32 * 8) = 0;
                }
                lVar32 = lVar32 + 1;
              } while (lVar32 != 0x85ae);
            }
            (cpi->oxcf).superres_cfg.superres_scale_denominator = (uint8_t)iVar37;
            (cpi->oxcf).superres_cfg.superres_kf_scale_denominator = (uint8_t)iVar37;
            local_128[1] = 0x7fffffffffffffff;
            local_128[0] = 0x7fffffffffffffff;
            cpi->superres_mode = AOM_SUPERRES_AUTO;
            uVar30 = encode_with_recode_loop_and_filter
                               (cpi,frame_size,(uint8_t *)local_1f0,dest_size_00,local_128 + 1,
                                local_128,&local_1f4);
            cpi->superres_mode = AOM_SUPERRES_NONE;
            (cpi->oxcf).superres_cfg.superres_scale_denominator = '\b';
            (cpi->oxcf).superres_cfg.superres_kf_scale_denominator = '\b';
          }
        }
      }
      else {
        cpi->superres_mode = AOM_SUPERRES_AUTO;
        uVar30 = encode_with_recode_loop_and_filter
                           (cpi,frame_size,dest,local_1e8,(int64_t *)&local_1b0,&local_1b8,
                            &local_1dc);
        cpi->superres_mode = AOM_SUPERRES_NONE;
        if (uVar30 == 0) {
          uVar16 = *(undefined8 *)(cpi->coding_context).lf.filter_level;
          iVar26 = (cpi->coding_context).lf.filter_level_u;
          iVar27 = (cpi->coding_context).lf.filter_level_v;
          uVar17 = *(undefined8 *)(cpi->coding_context).lf.backup_filter_level;
          iVar29 = (cpi->coding_context).lf.backup_filter_level_u;
          iVar37 = (cpi->coding_context).lf.backup_filter_level_v;
          uVar8 = (cpi->coding_context).lf.mode_ref_delta_enabled;
          uVar7 = (cpi->coding_context).lf.mode_ref_delta_update;
          iVar24 = (cpi->coding_context).lf.ref_deltas[0];
          iVar25 = (cpi->coding_context).lf.ref_deltas[1];
          uVar18 = *(undefined8 *)((cpi->coding_context).lf.ref_deltas + 2);
          uVar19 = *(undefined8 *)(cpi->coding_context).cdef_info.cdef_strengths;
          uVar20 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 2);
          (cpi->common).lf.sharpness_level = (cpi->coding_context).lf.sharpness_level;
          (cpi->common).lf.mode_ref_delta_enabled = uVar8;
          (cpi->common).lf.mode_ref_delta_update = uVar7;
          (cpi->common).lf.ref_deltas[0] = iVar24;
          (cpi->common).lf.ref_deltas[1] = iVar25;
          *(undefined8 *)((cpi->common).lf.ref_deltas + 2) = uVar18;
          *(undefined8 *)(cpi->common).lf.backup_filter_level = uVar17;
          (cpi->common).lf.backup_filter_level_u = iVar29;
          (cpi->common).lf.backup_filter_level_v = iVar37;
          *(undefined8 *)(cpi->common).lf.filter_level = uVar16;
          (cpi->common).lf.filter_level_u = iVar26;
          (cpi->common).lf.filter_level_v = iVar27;
          (cpi->common).cdef_info.cdef_bits = (cpi->coding_context).cdef_info.cdef_bits;
          *(undefined8 *)(cpi->common).cdef_info.cdef_strengths = uVar19;
          *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 2) = uVar20;
          uVar16 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 6);
          *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 4) =
               *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 4);
          *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 6) = uVar16;
          uVar16 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 10);
          *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 8) =
               *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 8);
          *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 10) = uVar16;
          uVar16 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 0xe);
          *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 0xc) =
               *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 0xc);
          *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 0xe) = uVar16;
          uVar16 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 2);
          *(undefined8 *)(cpi->common).cdef_info.cdef_uv_strengths =
               *(undefined8 *)(cpi->coding_context).cdef_info.cdef_uv_strengths;
          *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 2) = uVar16;
          uVar16 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 6);
          *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 4) =
               *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 4);
          *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 6) = uVar16;
          uVar16 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 10);
          *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 8) =
               *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 8);
          *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 10) = uVar16;
          uVar16 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 0xe);
          *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 0xc) =
               *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 0xc);
          *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 0xe) = uVar16;
          iVar29 = (cpi->coding_context).cdef_info.nb_cdef_strengths;
          (cpi->common).cdef_info.cdef_damping = (cpi->coding_context).cdef_info.cdef_damping;
          (cpi->common).cdef_info.nb_cdef_strengths = iVar29;
          local_1f0 = &cpi->rc;
          local_1c0 = (CODING_CONTEXT *)&(cpi->coding_context).rc;
          memcpy(local_1f0,local_1c0,0x140);
          pAVar12 = cpi->ppi;
          local_1c8 = &(cpi->coding_context).mv_stats;
          pMVar38 = local_1c8;
          pMVar39 = &pAVar12->mv_stats;
          for (lVar32 = 9; lVar32 != 0; lVar32 = lVar32 + -1) {
            iVar29 = pMVar38->q;
            pMVar39->high_prec = pMVar38->high_prec;
            pMVar39->q = iVar29;
            pMVar38 = (MV_STATS *)((long)pMVar38 + (ulong)bVar33 * -0x10 + 8);
            pMVar39 = (MV_STATS *)((long)pMVar39 + ((ulong)bVar33 * -2 + 1) * 8);
          }
          (pAVar12->mv_stats).valid = (cpi->coding_context).mv_stats.valid;
          if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
            _Var44 = (cpi->refresh_frame).golden_frame;
            bVar34 = 1;
            lVar32 = 0x85a7;
            do {
              piVar40 = *(int **)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) +
                                 lVar32 * 8);
              if ((((lVar32 == 0x85aa) && ((cpi->oxcf).pass == AOM_RC_ONE_PASS)) &&
                  (cpi->ppi->lap_enabled == 0)) &&
                 ((((cpi->oxcf).mode == '\x01' && ((cpi->oxcf).gf_cfg.lag_in_frames == 0)) &&
                  ((cpi->ppi->use_svc == 0 && (piVar40 != (int *)0x0)))))) {
                pRVar14 = (cpi->common).ref_frame_map[(cpi->common).remapped_ref_idx[3]];
                if (piVar40[0x13c] == (pRVar14->buf).field_2.field_0.y_crop_width) {
                  bVar43 = piVar40[0x13e] == (pRVar14->buf).field_3.field_0.y_crop_height;
                }
                else {
                  bVar43 = false;
                }
                bVar34 = bVar43 | _Var44 & 1U;
              }
              if ((piVar40 != (int *)0x0) && ((lVar32 != 0x85aa || (bVar34 != 0)))) {
                *piVar40 = *piVar40 + -1;
                *(undefined8 *)
                 ((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar32 * 8) = 0;
              }
              lVar32 = lVar32 + 1;
            } while (lVar32 != 0x85ae);
          }
          uVar30 = encode_with_recode_loop_and_filter
                             (cpi,frame_size,dest,local_1e8,&local_1d0,&local_1d8,&local_1e0);
          uVar35 = local_1a0;
          if (uVar30 == 0) {
            iVar29 = av1_compute_rd_mult_based_on_qindex
                               ((aom_bit_depth_t)local_1a0,(FRAME_UPDATE_TYPE)local_1a8,
                                (cpi->common).quant_params.base_qindex,(cpi->oxcf).tune_cfg.tuning);
            bVar34 = (char)uVar35 * '\x02' - 0x10;
            if ((double)(local_1d0 >> (bVar34 & 0x3f)) * 128.0 +
                (double)local_1d8 * (double)iVar29 * 0.001953125 <=
                (double)((long)local_1b0 >> (bVar34 & 0x3f)) * 128.0 +
                (double)local_1b8 * (double)iVar29 * 0.001953125) {
              local_1f4 = local_1e0;
              uVar30 = 0;
            }
            else {
              uVar16 = *(undefined8 *)(cpi->coding_context).lf.filter_level;
              iVar26 = (cpi->coding_context).lf.filter_level_u;
              iVar27 = (cpi->coding_context).lf.filter_level_v;
              uVar17 = *(undefined8 *)(cpi->coding_context).lf.backup_filter_level;
              iVar29 = (cpi->coding_context).lf.backup_filter_level_u;
              iVar37 = (cpi->coding_context).lf.backup_filter_level_v;
              uVar8 = (cpi->coding_context).lf.mode_ref_delta_enabled;
              uVar7 = (cpi->coding_context).lf.mode_ref_delta_update;
              iVar24 = (cpi->coding_context).lf.ref_deltas[0];
              iVar25 = (cpi->coding_context).lf.ref_deltas[1];
              uVar18 = *(undefined8 *)((cpi->coding_context).lf.ref_deltas + 2);
              (cpi->common).lf.sharpness_level = (cpi->coding_context).lf.sharpness_level;
              (cpi->common).lf.mode_ref_delta_enabled = uVar8;
              (cpi->common).lf.mode_ref_delta_update = uVar7;
              (cpi->common).lf.ref_deltas[0] = iVar24;
              (cpi->common).lf.ref_deltas[1] = iVar25;
              *(undefined8 *)((cpi->common).lf.ref_deltas + 2) = uVar18;
              *(undefined8 *)(cpi->common).lf.backup_filter_level = uVar17;
              (cpi->common).lf.backup_filter_level_u = iVar29;
              (cpi->common).lf.backup_filter_level_v = iVar37;
              *(undefined8 *)(cpi->common).lf.filter_level = uVar16;
              (cpi->common).lf.filter_level_u = iVar26;
              (cpi->common).lf.filter_level_v = iVar27;
              (cpi->common).cdef_info.cdef_bits = (cpi->coding_context).cdef_info.cdef_bits;
              uVar16 = *(undefined8 *)(cpi->coding_context).cdef_info.cdef_strengths;
              uVar17 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 2);
              uVar18 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 4);
              uVar19 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 6);
              uVar20 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 8);
              uVar21 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 10);
              uVar22 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 0xe);
              *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 0xc) =
                   *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 0xc);
              *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 0xe) = uVar22;
              *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 8) = uVar20;
              *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 10) = uVar21;
              *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 4) = uVar18;
              *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 6) = uVar19;
              *(undefined8 *)(cpi->common).cdef_info.cdef_strengths = uVar16;
              *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 2) = uVar17;
              uVar16 = *(undefined8 *)(cpi->coding_context).cdef_info.cdef_uv_strengths;
              uVar17 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 2);
              uVar18 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 4);
              uVar19 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 6);
              uVar20 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 8);
              uVar21 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 10);
              uVar22 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 0xe);
              *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 0xc) =
                   *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 0xc);
              *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 0xe) = uVar22;
              *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 8) = uVar20;
              *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 10) = uVar21;
              *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 4) = uVar18;
              *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 6) = uVar19;
              *(undefined8 *)(cpi->common).cdef_info.cdef_uv_strengths = uVar16;
              *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 2) = uVar17;
              iVar29 = (cpi->coding_context).cdef_info.nb_cdef_strengths;
              (cpi->common).cdef_info.cdef_damping = (cpi->coding_context).cdef_info.cdef_damping;
              (cpi->common).cdef_info.nb_cdef_strengths = iVar29;
              memcpy(local_1f0,local_1c0,0x140);
              pAVar12 = cpi->ppi;
              pMVar38 = local_1c8;
              pMVar39 = &pAVar12->mv_stats;
              for (lVar32 = 9; lVar32 != 0; lVar32 = lVar32 + -1) {
                iVar29 = pMVar38->q;
                pMVar39->high_prec = pMVar38->high_prec;
                pMVar39->q = iVar29;
                pMVar38 = (MV_STATS *)((long)pMVar38 + (ulong)bVar33 * -0x10 + 8);
                pMVar39 = (MV_STATS *)((long)pMVar39 + ((ulong)bVar33 * -2 + 1) * 8);
              }
              (pAVar12->mv_stats).valid = local_1c8->valid;
              if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
                _Var44 = (cpi->refresh_frame).golden_frame;
                bVar33 = 1;
                lVar32 = 0x85a7;
                do {
                  piVar40 = *(int **)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) +
                                     lVar32 * 8);
                  if ((((((lVar32 == 0x85aa) && ((cpi->oxcf).pass == AOM_RC_ONE_PASS)) &&
                        (cpi->ppi->lap_enabled == 0)) &&
                       (((cpi->oxcf).mode == '\x01' && ((cpi->oxcf).gf_cfg.lag_in_frames == 0)))) &&
                      (cpi->ppi->use_svc == 0)) && (piVar40 != (int *)0x0)) {
                    pRVar14 = (cpi->common).ref_frame_map[(cpi->common).remapped_ref_idx[3]];
                    if (piVar40[0x13c] == (pRVar14->buf).field_2.field_0.y_crop_width) {
                      bVar43 = piVar40[0x13e] == (pRVar14->buf).field_3.field_0.y_crop_height;
                    }
                    else {
                      bVar43 = false;
                    }
                    bVar33 = bVar43 | _Var44 & 1U;
                  }
                  if ((piVar40 != (int *)0x0) && ((lVar32 != 0x85aa || (bVar33 != 0)))) {
                    *piVar40 = *piVar40 + -1;
                    *(undefined8 *)
                     ((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar32 * 8) = 0;
                  }
                  lVar32 = lVar32 + 1;
                } while (lVar32 != 0x85ae);
              }
              local_d8.psnr[0] = NAN;
              local_128[2] = 0x7fffffffffffffff;
              cpi->superres_mode = AOM_SUPERRES_AUTO;
              uVar30 = encode_with_recode_loop_and_filter
                                 (cpi,frame_size,dest,local_1e8,(int64_t *)&local_d8,local_128 + 2,
                                  &local_1f4);
              cpi->superres_mode = AOM_SUPERRES_NONE;
            }
          }
        }
      }
LAB_001b2ddd:
      bVar43 = true;
      if (uVar30 != 0) goto LAB_001b303b;
    }
    pAVar2 = local_150;
    if (pSVar41->frame_id_numbers_present_flag != '\0') {
      uVar30 = (cpi->common).current_frame.refresh_frame_flags;
      lVar32 = 0;
      do {
        if ((uVar30 >> ((uint)lVar32 & 0x1f) & 1) != 0) {
          (cpi->common).ref_frame_id[lVar32] = (cpi->common).current_frame_id;
        }
        lVar32 = lVar32 + 1;
      } while (lVar32 != 8);
    }
    if ((cpi->svc).spatial_layer_id == (cpi->svc).number_spatial_layers + -1) {
      piVar40 = &(cpi->svc).num_encoded_top_layer;
      *piVar40 = *piVar40 + 1;
    }
    if ((((cpi->common).seg.enabled != '\0') && ((cpi->common).seg.update_map == '\0')) &&
       (puVar15 = (cpi->common).last_frame_seg_map, puVar15 != (uint8_t *)0x0)) {
      pRVar14 = (cpi->common).cur_frame;
      memcpy(pRVar14->seg_map,puVar15,(long)pRVar14->mi_rows * (long)pRVar14->mi_cols);
    }
    if (((cpi->ppi->gf_group).frame_parallel_level[cpi->gf_frame_index] == 0) &&
       (((pAVar2->current_frame).frame_type & 0xfd) != 0)) {
      release_scaled_references(cpi);
    }
    if ((cpi->common).show_frame != 0) {
      cpi->last_show_frame_buf = (cpi->common).cur_frame;
    }
    if ((cpi->common).features.refresh_frame_context == '\x01') {
      memcpy((cpi->common).fc,&cpi->tile_data[local_1f4].tctx,0x52fc);
      av1_reset_cdf_symbol_counters((cpi->common).fc);
    }
    if ((cpi->common).tiles.large_scale == 0) {
      memcpy(&((cpi->common).cur_frame)->frame_context,(cpi->common).fc,0x52fc);
    }
    if ((((cpi->oxcf).tile_cfg.enable_ext_tile_debug == true) &&
        ((cpi->common).tiles.large_scale != 0)) &&
       ((aVar9 = (cpi->oxcf).pass, AOM_RC_FIRST_PASS < aVar9 ||
        (((aVar9 == AOM_RC_ONE_PASS && (cpi->compressor_stage == '\0')) &&
         (cpi->ppi->lap_enabled != 0)))))) {
      local_d8.psnr[1] = 0.0;
      local_d8.psnr[2]._0_4_ = 0;
      uVar30 = (cpi->common).current_frame.frame_number;
      local_d8.psnr[0]._0_5_ = CONCAT14((char)(uVar30 / 100) + '0',0x63662f2e);
      uVar23 = CONCAT15((char)((ulong)(uVar30 % 100) * 0x1999999a >> 0x20),local_d8.psnr[0]._0_5_);
      local_d8.psnr[0] =
           (double)(ulong)(CONCAT16((char)uVar30 + (char)(uVar30 / 10) * -10,uVar23) |
                          0x30300000000000);
      av1_print_frame_contexts((cpi->common).fc,(char *)&local_d8);
    }
    _Var44 = (cpi->common).features.disable_cdf_update;
    cpi->last_frame_type = (cpi->common).current_frame.frame_type;
    iVar29 = 1;
    if (_Var44 == true) {
      iVar29 = cpi->frames_since_last_update + 1;
    }
    cpi->frames_since_last_update = iVar29;
    iVar29 = (cpi->svc).number_spatial_layers;
    if ((cpi->svc).spatial_layer_id == iVar29 + -1) {
      (cpi->svc).prev_number_spatial_layers = iVar29;
    }
    (cpi->svc).prev_number_temporal_layers = (cpi->svc).number_temporal_layers;
    (cpi->common).seg.update_map = '\0';
    (cpi->common).seg.update_data = '\0';
    (cpi->common).lf.mode_ref_delta_update = '\0';
  }
  bVar43 = false;
  if ((cpi->common).show_frame != 0) {
    (cpi->frame_index_set).show_frame_count = (cpi->frame_index_set).show_frame_count + 1;
    puVar3 = &(cpi->common).current_frame.frame_number;
    *puVar3 = *puVar3 + 1;
  }
LAB_001b303b:
  if (!bVar43) {
    return 0;
  }
  return 1;
}

Assistant:

int av1_encode(AV1_COMP *const cpi, uint8_t *const dest, size_t dest_size,
               const EncodeFrameInput *const frame_input,
               const EncodeFrameParams *const frame_params,
               size_t *const frame_size) {
  AV1_COMMON *const cm = &cpi->common;
  CurrentFrame *const current_frame = &cm->current_frame;

  cpi->unscaled_source = frame_input->source;
  cpi->source = frame_input->source;
  cpi->unscaled_last_source = frame_input->last_source;

  current_frame->refresh_frame_flags = frame_params->refresh_frame_flags;
  cm->features.error_resilient_mode = frame_params->error_resilient_mode;
  cm->features.primary_ref_frame = frame_params->primary_ref_frame;
  cm->current_frame.frame_type = frame_params->frame_type;
  cm->show_frame = frame_params->show_frame;
  cpi->ref_frame_flags = frame_params->ref_frame_flags;
  cpi->speed = frame_params->speed;
  cm->show_existing_frame = frame_params->show_existing_frame;
  cpi->existing_fb_idx_to_show = frame_params->existing_fb_idx_to_show;

  memcpy(cm->remapped_ref_idx, frame_params->remapped_ref_idx,
         REF_FRAMES * sizeof(*cm->remapped_ref_idx));

  memcpy(&cpi->refresh_frame, &frame_params->refresh_frame,
         sizeof(cpi->refresh_frame));

  if (current_frame->frame_type == KEY_FRAME &&
      cpi->ppi->gf_group.refbuf_state[cpi->gf_frame_index] == REFBUF_RESET) {
    current_frame->frame_number = 0;
  }

  current_frame->order_hint =
      current_frame->frame_number + frame_params->order_offset;

  current_frame->display_order_hint = current_frame->order_hint;
  current_frame->order_hint %=
      (1 << (cm->seq_params->order_hint_info.order_hint_bits_minus_1 + 1));

  current_frame->pyramid_level = get_true_pyr_level(
      cpi->ppi->gf_group.layer_depth[cpi->gf_frame_index],
      current_frame->display_order_hint, cpi->ppi->gf_group.max_layer_depth);

  if (is_stat_generation_stage(cpi)) {
#if !CONFIG_REALTIME_ONLY
    if (cpi->oxcf.q_cfg.use_fixed_qp_offsets)
      av1_noop_first_pass_frame(cpi, frame_input->ts_duration);
    else
      av1_first_pass(cpi, frame_input->ts_duration);
#endif
  } else if (cpi->oxcf.pass == AOM_RC_ONE_PASS ||
             cpi->oxcf.pass >= AOM_RC_SECOND_PASS) {
    if (encode_frame_to_data_rate(cpi, frame_size, dest, dest_size) !=
        AOM_CODEC_OK) {
      return AOM_CODEC_ERROR;
    }
  } else {
    return AOM_CODEC_ERROR;
  }

  return AOM_CODEC_OK;
}